

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_image_function.cpp
# Opt level: O3

void example1(Image *imageIn1,Image *imageIn2,Image *imageOut)

{
  Image croppedIn1;
  Image croppedOut;
  Image croppedIn2;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&croppedIn1,0x80,0x80,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&croppedIn2,0x80,0x80,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&croppedOut,0x80,0x80,'\x01','\x01');
  Image_Function::Copy(imageIn1,10,10,&croppedIn1,0,0,0x80,0x80);
  Image_Function::Copy(imageIn2,0x28a,0x300,&croppedIn1,0,0,0x80,0x80);
  Image_Function::BitwiseOr(&croppedIn1,&croppedIn2,&croppedOut);
  Image_Function::Copy(&croppedOut,0,0,imageOut,0,0,0x80,0x80);
  croppedOut._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&croppedOut);
  croppedIn2._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&croppedIn2);
  croppedIn1._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&croppedIn1);
  return;
}

Assistant:

void example1( const PenguinV_Image::Image & imageIn1, const PenguinV_Image::Image & imageIn2, PenguinV_Image::Image & imageOut )
{
    // We allocate another images with size 128 x 128
    PenguinV_Image::Image croppedIn1( 128, 128 );
    PenguinV_Image::Image croppedIn2( 128, 128 );
    PenguinV_Image::Image croppedOut( 128, 128 );

    // Copy information from input images to cropped images

    // It is not a good style of programming but it is easy to explain all parameters!
    Image_Function::Copy( imageIn1,   // first input image
                          10,         // X coordinate where we get information from first input image
                          10,         // Y coordinate where we get information from first input image
                          croppedIn1, // first cropped image
                          0,          // X coordinate where we put information to first cropped image
                          0,          // Y coordinate where we put information to first cropped image
                          128,        // width of copying area
                          128         // height of copying area
    );

    Image_Function::Copy( imageIn2,   // second input image
                          650,        // X coordinate where we get information from second input image
                          768,        // Y coordinate where we get information from second input image
                          croppedIn1, // second cropped image
                          0,          // X coordinate where we put information to second cropped image
                          0,          // Y coordinate where we put information to second cropped image
                          128,        // width of copying area
                          128         // height of copying area
    );

    // Do Bitwise OR
    Image_Function::BitwiseOr( croppedIn1, croppedIn2, croppedOut );

    // Copy the result into output image
    Image_Function::Copy( croppedOut, // cropped output image
                          0,          // X coordinate where we get information from cropped output image
                          0,          // Y coordinate where we get information from cropped output image
                          imageOut,   // output image
                          0,          // X coordinate where we put information to output image
                          0,          // Y coordinate where we put information to output image
                          128,        // width of copying area
                          128         // height of copying area
    );
}